

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  int32 iVar4;
  char *pcVar5;
  string *psVar6;
  uint8 *puVar7;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  UnknownFieldSet *pUVar8;
  int local_304;
  int local_300;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  uint8 *target_local;
  FileDescriptorProto *this_local;
  byte *local_100;
  byte *local_e8;
  uint8 *local_d0;
  byte *local_b8;
  byte *local_a0;
  byte *local_88;
  byte *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  _i_1 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_d0 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_d0 = target + 2;
    }
    else {
      local_d0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_d0);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar6,puVar7);
  }
  bVar1 = has_package(this);
  if (bVar1) {
    package_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = package_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_e8 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_e8 = _i_1 + 2;
    }
    else {
      local_e8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_e8);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar6,puVar7);
  }
  for (i_2 = 0; iVar2 = dependency_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    dependency_abi_cxx11_(this,i_2);
    pcVar5 = (char *)std::__cxx11::string::data();
    dependency_abi_cxx11_(this,i_2);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = dependency_abi_cxx11_(this,i_2);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_100 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_100 = _i_1 + 2;
    }
    else {
      local_100 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_100);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar6,puVar7);
  }
  for (i_3 = 0; iVar2 = message_type_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    this_00 = message_type(this,i_3);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_b8 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_b8 = _i_1 + 2;
    }
    else {
      local_b8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = DescriptorProto::GetCachedSize(this_00);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_b8);
    _i_1 = DescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar7);
  }
  for (i_4 = 0; iVar2 = enum_type_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
    this_01 = enum_type(this,i_4);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_a0 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_a0 = _i_1 + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = EnumDescriptorProto::GetCachedSize(this_01);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_a0);
    _i_1 = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar7);
  }
  for (i_5 = 0; iVar2 = service_size(this), i_5 < iVar2; i_5 = i_5 + 1) {
    this_02 = service(this,i_5);
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_88 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_88 = _i_1 + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = ServiceDescriptorProto::GetCachedSize(this_02);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_88);
    _i_1 = ServiceDescriptorProto::SerializeWithCachedSizesToArray(this_02,puVar7);
  }
  for (i_6 = 0; iVar2 = extension_size(this), i_6 < iVar2; i_6 = i_6 + 1) {
    this_03 = extension(this,i_6);
    uVar3 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_70 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_70 = _i_1 + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = FieldDescriptorProto::GetCachedSize(this_03);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_70);
    _i_1 = FieldDescriptorProto::SerializeWithCachedSizesToArray(this_03,puVar7);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_04 = options(this);
    uVar3 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_58 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_58 = _i_1 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = FileOptions::GetCachedSize(this_04);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_58);
    _i_1 = FileOptions::SerializeWithCachedSizesToArray(this_04,puVar7);
  }
  bVar1 = has_source_code_info(this);
  if (bVar1) {
    this_05 = source_code_info(this);
    uVar3 = internal::WireFormatLite::MakeTag(9,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_40 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_40 = _i_1 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = SourceCodeInfo::GetCachedSize(this_05);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    _i_1 = SourceCodeInfo::SerializeWithCachedSizesToArray(this_05,puVar7);
  }
  for (local_300 = 0; iVar2 = public_dependency_size(this), local_300 < iVar2;
      local_300 = local_300 + 1) {
    iVar4 = public_dependency(this,local_300);
    uVar3 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_10 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_10 = _i_1 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    _i_1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,local_10);
  }
  for (local_304 = 0; iVar2 = weak_dependency_size(this), local_304 < iVar2;
      local_304 = local_304 + 1) {
    iVar4 = weak_dependency(this,local_304);
    uVar3 = internal::WireFormatLite::MakeTag(0xb,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_28 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_28 = _i_1 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    _i_1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,local_28);
  }
  pUVar8 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar8);
  if (!bVar1) {
    pUVar8 = unknown_fields(this);
    _i_1 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar8,_i_1);
  }
  return _i_1;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->message_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->enum_type(i), target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->service(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->extension(i), target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        9, this->source_code_info(), target);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(10, this->public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(11, this->weak_dependency(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}